

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-macros.h
# Opt level: O2

void mul64To128(uint64_t a,uint64_t b,uint64_t *z0Ptr,uint64_t *z1Ptr)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = (a & 0xffffffff) * (b >> 0x20);
  uVar2 = (b & 0xffffffff) * (a >> 0x20);
  uVar3 = uVar2 + uVar1;
  *z1Ptr = b * a;
  *z0Ptr = (uVar3 >> 0x20) + (b >> 0x20) * (a >> 0x20) + ((ulong)CARRY8(uVar2,uVar1) << 0x20) +
           (ulong)(b * a < uVar3 << 0x20);
  return;
}

Assistant:

static inline void mul64To128( uint64_t a, uint64_t b, uint64_t *z0Ptr, uint64_t *z1Ptr )
{
    uint32_t aHigh, aLow, bHigh, bLow;
    uint64_t z0, zMiddleA, zMiddleB, z1;

    aLow = a;
    aHigh = a>>32;
    bLow = b;
    bHigh = b>>32;
    z1 = ( (uint64_t) aLow ) * bLow;
    zMiddleA = ( (uint64_t) aLow ) * bHigh;
    zMiddleB = ( (uint64_t) aHigh ) * bLow;
    z0 = ( (uint64_t) aHigh ) * bHigh;
    zMiddleA += zMiddleB;
    z0 += ( ( (uint64_t) ( zMiddleA < zMiddleB ) )<<32 ) + ( zMiddleA>>32 );
    zMiddleA <<= 32;
    z1 += zMiddleA;
    z0 += ( z1 < zMiddleA );
    *z1Ptr = z1;
    *z0Ptr = z0;

}